

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O3

String<char> __thiscall Qentem::StringStream<char>::GetString(StringStream<char> *this)

{
  uint size;
  char *pcVar1;
  char *to;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  StringStream<char> *in_RSI;
  SizeT len;
  String<char> SVar2;
  
  size = in_RSI->length_;
  pcVar1 = in_RSI->storage_;
  if (size < in_RSI->capacity_) {
    pcVar1[size] = '\0';
    pcVar1 = in_RSI->storage_;
    in_RSI->storage_ = (char *)0x0;
    in_RSI->length_ = 0;
    in_RSI->capacity_ = 0;
    this->length_ = size;
    this->storage_ = pcVar1;
  }
  else {
    this->storage_ = (char *)0x0;
    this->length_ = 0;
    to = String<char>::allocate((String<char> *)this,size + 1);
    Memory::Copy<unsigned_int>(to,pcVar1,size);
    to[size] = '\0';
    this->length_ = size;
    Reset(in_RSI);
    in_RDX = extraout_RDX;
  }
  SVar2._8_8_ = in_RDX;
  SVar2.storage_ = (char *)this;
  return SVar2;
}

Assistant:

String<Char_T> GetString() {
        if (Capacity() > Length()) {
            const SizeT len     = Length();
            Storage()[Length()] = Char_T{0};
            return String<Char_T>(Detach(), len);
        }

        String<Char_T> str{First(), Length()};

        Reset();

        return str;
    }